

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O0

int mmk_strneq(char *src,char *ref,size_t n)

{
  bool bVar1;
  byte local_2a;
  size_t local_28;
  size_t n_local;
  char *ref_local;
  char *src_local;
  
  local_28 = n;
  n_local = (size_t)ref;
  ref_local = src;
  while( true ) {
    bVar1 = false;
    if ((*ref_local != '\0') && (bVar1 = false, *(char *)n_local != '\0')) {
      bVar1 = local_28 != 0;
    }
    if (!bVar1) break;
    if (*ref_local != *(char *)n_local) {
      return 0;
    }
    ref_local = ref_local + 1;
    n_local = n_local + 1;
    local_28 = local_28 - 1;
  }
  local_2a = 1;
  if (local_28 != 0) {
    local_2a = *(char *)n_local != '\0' ^ 0xff;
  }
  return (uint)(local_2a & 1);
}

Assistant:

int mmk_strneq(const char *src, const char *ref, size_t n)
{
    for (; *src && *ref && n; ++src, ++ref, --n) {
        if (*src != *ref)
            return 0;
    }
    return n == 0 || !*ref;
}